

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::SetPropertyDescriptor
               (RecyclableObject *object,PropertyId propId,PropertyDescriptor *descriptor)

{
  bool bVar1;
  Var pvVar2;
  Var pvVar3;
  PropertyValueInfo local_68;
  
  if (descriptor->valueSpecified == true) {
    local_68.m_instance = (RecyclableObject *)0x0;
    local_68.m_propertyIndex = 0xffff;
    local_68.m_attributes = '\0';
    local_68.flags = InlineCacheNoFlags;
    local_68.cacheInfoFlag = defaultInfoFlags;
    local_68.inlineCache = (InlineCache *)0x0;
    local_68.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    local_68.functionBody = (FunctionBody *)0x0;
    local_68.prop = (RecyclableObject *)0x0;
    local_68.propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
    local_68.inlineCacheIndex = 0xffffffff;
    local_68.allowResizingPolymorphicInlineCache = true;
    SetProperty_Internal<false>
              (object,object,false,propId,(descriptor->Value).ptr,&local_68,
               (((((object->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr,PropertyOperation_None);
  }
  else if ((descriptor->getterSpecified != false) || (descriptor->setterSpecified == true)) {
    pvVar2 = PropertyDescriptor::GetGetter(descriptor);
    pvVar3 = PropertyDescriptor::GetSetter(descriptor);
    if (object != (RecyclableObject *)0x0) {
      (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x2d])(object,propId,pvVar2,pvVar3,0);
    }
  }
  if (descriptor->enumerableSpecified == true) {
    bVar1 = PropertyDescriptor::IsEnumerable(descriptor);
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3d])(object,propId,(ulong)bVar1);
  }
  if (descriptor->configurableSpecified == true) {
    bVar1 = PropertyDescriptor::IsConfigurable(descriptor);
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3c])(object,propId,(ulong)bVar1);
  }
  if (descriptor->writableSpecified == true) {
    bVar1 = PropertyDescriptor::IsWritable(descriptor);
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3b])(object,propId,(ulong)bVar1);
  }
  return 1;
}

Assistant:

BOOL JavascriptOperators::SetPropertyDescriptor(RecyclableObject* object, PropertyId propId, const PropertyDescriptor& descriptor)
    {
        if (descriptor.ValueSpecified())
        {
            ScriptContext* requestContext = object->GetScriptContext(); // Real requestContext?
            JavascriptOperators::SetProperty(object, object, propId, descriptor.GetValue(), requestContext);
        }
        else if (descriptor.GetterSpecified() || descriptor.SetterSpecified())
        {
            JavascriptOperators::SetAccessors(object, propId, descriptor.GetGetter(), descriptor.GetSetter());
        }

        if (descriptor.EnumerableSpecified())
        {
            object->SetEnumerable(propId, descriptor.IsEnumerable());
        }
        if (descriptor.ConfigurableSpecified())
        {
            object->SetConfigurable(propId, descriptor.IsConfigurable());
        }
        if (descriptor.WritableSpecified())
        {
            object->SetWritable(propId, descriptor.IsWritable());
        }

        return true;
    }